

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

void SetPixelColor(void *dstPtr,Color color,int format)

{
  char cVar1;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [14];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [14];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [14];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined3 uVar31;
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined5 uVar41;
  undefined1 auVar42 [12];
  undefined1 auVar43 [15];
  undefined1 auVar44 [12];
  undefined1 auVar45 [15];
  undefined1 auVar46 [12];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [14];
  undefined1 auVar50 [15];
  undefined1 auVar51 [14];
  undefined1 auVar52 [15];
  undefined1 auVar53 [14];
  ushort uVar54;
  byte bVar55;
  uint uVar56;
  byte bVar57;
  uint uVar58;
  short sVar59;
  ushort uVar60;
  float fVar62;
  float fVar64;
  float fVar65;
  int iVar66;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  undefined1 auVar70 [12];
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  int iVar82;
  int iVar83;
  undefined1 auVar71 [12];
  ushort uVar81;
  float extraout_XMM0_Db;
  undefined1 auVar75 [16];
  float fVar63;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  int iVar84;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  undefined4 uVar61;
  undefined6 uVar67;
  undefined8 uVar68;
  undefined1 auVar69 [12];
  undefined1 auVar72 [14];
  undefined1 auVar73 [14];
  undefined1 auVar74 [14];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  
  if (6 < format - 1U) {
    return;
  }
  uVar58 = (uint)color >> 8;
  uVar56 = (uint)color >> 0x10;
  bVar57 = color.g;
  bVar55 = color.b;
  switch(format) {
  case 1:
    *(char *)dstPtr =
         (char)(int)((((float)(uVar56 & 0xff) / 255.0) * 0.114 +
                     ((float)((uint)color & 0xff) / 255.0) * 0.299 +
                     ((float)(uVar58 & 0xff) / 255.0) * 0.587) * 255.0);
    break;
  case 2:
    *(char *)dstPtr =
         (char)(int)((((float)(uVar56 & 0xff) / 255.0) * 0.114 +
                     ((float)((uint)color & 0xff) / 255.0) * 0.299 +
                     ((float)(uVar58 & 0xff) / 255.0) * 0.587) * 255.0);
    *(uchar *)((long)dstPtr + 1) = color.a;
    break;
  case 3:
    fVar62 = roundf(((float)(uVar56 & 0xff) / 255.0) * 31.0);
    auVar19._4_4_ = (float)bVar57;
    auVar19._0_4_ = (float)((uint)color & 0xff);
    auVar19._8_8_ = 0;
    auVar79 = divps(auVar19,_DAT_0015d8c0);
    fVar63 = roundf(auVar79._0_4_ * 31.0);
    fVar64 = roundf(auVar79._4_4_ * 63.0);
    iVar66 = (int)fVar63;
    iVar82 = (int)fVar64;
    iVar83 = (int)extraout_XMM0_Db_01;
    iVar84 = (int)extraout_XMM0_Db_02;
    sVar7 = (short)iVar66;
    cVar4 = (0 < sVar7) * (sVar7 < 0x100) * (char)iVar66 - (0xff < sVar7);
    sVar8 = (short)((uint)iVar66 >> 0x10);
    cVar3 = (char)((uint)iVar66 >> 0x10);
    sVar59 = CONCAT11((0 < sVar8) * (sVar8 < 0x100) * cVar3 - (0xff < sVar8),cVar4);
    sVar9 = (short)iVar82;
    cVar5 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar82 - (0xff < sVar9);
    sVar10 = (short)((uint)iVar82 >> 0x10);
    cVar2 = (char)((uint)iVar82 >> 0x10);
    uVar61 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * cVar2 - (0xff < sVar10),
                      CONCAT12(cVar5,sVar59));
    sVar11 = (short)iVar83;
    cVar15 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar83 - (0xff < sVar11);
    sVar12 = (short)((uint)iVar83 >> 0x10);
    cVar17 = (char)((uint)iVar83 >> 0x10);
    uVar67 = CONCAT15((0 < sVar12) * (sVar12 < 0x100) * cVar17 - (0xff < sVar12),
                      CONCAT14(cVar15,uVar61));
    sVar13 = (short)iVar84;
    cVar16 = (0 < sVar13) * (sVar13 < 0x100) * (char)iVar84 - (0xff < sVar13);
    sVar14 = (short)((uint)iVar84 >> 0x10);
    cVar18 = (char)((uint)iVar84 >> 0x10);
    uVar68 = CONCAT17((0 < sVar14) * (sVar14 < 0x100) * cVar18 - (0xff < sVar14),
                      CONCAT16(cVar16,uVar67));
    cVar6 = (0 < sVar7) * (sVar7 < 0x100) * (char)iVar66 - (0xff < sVar7);
    auVar70._0_10_ =
         CONCAT19((0 < sVar8) * (sVar8 < 0x100) * cVar3 - (0xff < sVar8),CONCAT18(cVar6,uVar68));
    cVar1 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar82 - (0xff < sVar9);
    auVar70[10] = cVar1;
    auVar70[0xb] = (0 < sVar10) * (sVar10 < 0x100) * cVar2 - (0xff < sVar10);
    cVar2 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar83 - (0xff < sVar11);
    auVar73[0xc] = cVar2;
    auVar73._0_12_ = auVar70;
    auVar73[0xd] = (0 < sVar12) * (sVar12 < 0x100) * cVar17 - (0xff < sVar12);
    cVar3 = (0 < sVar13) * (sVar13 < 0x100) * (char)iVar84 - (0xff < sVar13);
    auVar77[0xe] = cVar3;
    auVar77._0_14_ = auVar73;
    auVar77[0xf] = (0 < sVar14) * (sVar14 < 0x100) * cVar18 - (0xff < sVar14);
    sVar7 = (short)((uint)uVar61 >> 0x10);
    sVar8 = (short)((uint6)uVar67 >> 0x20);
    sVar9 = (short)((ulong)uVar68 >> 0x30);
    sVar10 = (short)((unkuint10)auVar70._0_10_ >> 0x40);
    sVar11 = auVar70._10_2_;
    sVar12 = auVar73._12_2_;
    sVar13 = auVar77._14_2_;
    cVar3 = (0 < sVar13) * (sVar13 < 0x100) * cVar3 - (0xff < sVar13);
    uVar54 = CONCAT11((0 < sVar59) * (sVar59 < 0x100) * cVar4 - (0xff < sVar59),cVar3);
    uVar31 = CONCAT12((0 < sVar7) * (sVar7 < 0x100) * cVar5 - (0xff < sVar7),uVar54);
    uVar56 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar15 - (0xff < sVar8),uVar31);
    uVar41 = CONCAT14((0 < sVar9) * (sVar9 < 0x100) * cVar16 - (0xff < sVar9),uVar56);
    auVar51[5] = (0 < sVar10) * (sVar10 < 0x100) * cVar6 - (0xff < sVar10);
    auVar51._0_5_ = uVar41;
    auVar51._6_8_ = 0;
    auVar33[0xe] = cVar3;
    auVar33._0_14_ = auVar51 << 0x38;
    auVar44._4_8_ = 0;
    auVar44._0_4_ = uVar56;
    auVar45._12_3_ =
         (int3)(CONCAT26(auVar33._13_2_,
                         CONCAT15((0 < sVar12) * (sVar12 < 0x100) * cVar2 - (0xff < sVar12),uVar41))
               >> 0x28);
    auVar45._0_12_ = auVar44 << 0x38;
    auVar50._10_5_ =
         (int5)(CONCAT44(auVar45._11_4_,
                         CONCAT13((0 < sVar11) * (sVar11 < 0x100) * cVar1 - (0xff < sVar11),uVar31))
               >> 0x18);
    auVar50._0_10_ = (unkuint10)uVar54 << 0x38;
    auVar38._8_8_ = 0;
    auVar38._0_8_ =
         CONCAT62(auVar50._9_6_,
                  CONCAT11((0 < sVar10) * (sVar10 < 0x100) * cVar6 - (0xff < sVar10),cVar3)) >> 8;
    auVar27._9_7_ = 0;
    auVar27._0_9_ = SUB169(auVar38 << 0x40,7);
    auVar26._10_6_ = 0;
    auVar26._0_10_ = SUB1610(auVar27 << 0x38,6);
    auVar25._11_5_ = 0;
    auVar25._0_11_ = SUB1611(auVar26 << 0x30,5);
    auVar37._12_4_ = 0;
    auVar37._0_12_ = SUB1612(auVar25 << 0x28,4);
    auVar24._1_13_ = SUB1613(auVar37 << 0x20,3);
    auVar24[0] = (0 < sVar7) * (sVar7 < 0x100) * cVar5 - (0xff < sVar7);
    uVar60 = (ushort)(byte)((0 < sVar59) * (sVar59 < 0x100) * cVar4 - (0xff < sVar59)) * 0x800;
    uVar81 = auVar24._0_2_ * 0x20;
    uVar54 = (ushort)(int)fVar62 & 0xff;
    goto LAB_0013faed;
  case 4:
    *(uchar *)dstPtr = color.r;
    *(byte *)((long)dstPtr + 1) = bVar57;
    *(byte *)((long)dstPtr + 2) = bVar55;
    break;
  case 5:
    fVar62 = roundf(((float)((uint)color & 0xff) / 255.0) * 31.0);
    auVar75._0_4_ = (float)(uVar58 & 0xff);
    auVar75._4_4_ = (float)bVar55;
    auVar75._8_8_ = 0;
    auVar79 = divps(auVar75,_DAT_0015d8c0);
    fVar63 = roundf(auVar79._0_4_ * 31.0);
    fVar64 = roundf(auVar79._4_4_ * 31.0);
    iVar66 = (int)fVar63;
    iVar82 = (int)fVar64;
    iVar83 = (int)extraout_XMM0_Db;
    iVar84 = (int)extraout_XMM0_Db_00;
    sVar7 = (short)iVar66;
    cVar16 = (0 < sVar7) * (sVar7 < 0x100) * (char)iVar66 - (0xff < sVar7);
    sVar8 = (short)((uint)iVar66 >> 0x10);
    cVar3 = (char)((uint)iVar66 >> 0x10);
    sVar59 = CONCAT11((0 < sVar8) * (sVar8 < 0x100) * cVar3 - (0xff < sVar8),cVar16);
    sVar9 = (short)iVar82;
    cVar6 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar82 - (0xff < sVar9);
    sVar10 = (short)((uint)iVar82 >> 0x10);
    cVar2 = (char)((uint)iVar82 >> 0x10);
    uVar61 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * cVar2 - (0xff < sVar10),
                      CONCAT12(cVar6,sVar59));
    sVar11 = (short)iVar83;
    cVar5 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar83 - (0xff < sVar11);
    sVar12 = (short)((uint)iVar83 >> 0x10);
    cVar1 = (char)((uint)iVar83 >> 0x10);
    uVar67 = CONCAT15((0 < sVar12) * (sVar12 < 0x100) * cVar1 - (0xff < sVar12),
                      CONCAT14(cVar5,uVar61));
    sVar13 = (short)iVar84;
    cVar4 = (0 < sVar13) * (sVar13 < 0x100) * (char)iVar84 - (0xff < sVar13);
    sVar14 = (short)((uint)iVar84 >> 0x10);
    cVar17 = (char)((uint)iVar84 >> 0x10);
    uVar68 = CONCAT17((0 < sVar14) * (sVar14 < 0x100) * cVar17 - (0xff < sVar14),
                      CONCAT16(cVar4,uVar67));
    cVar15 = (0 < sVar7) * (sVar7 < 0x100) * (char)iVar66 - (0xff < sVar7);
    auVar69._0_10_ =
         CONCAT19((0 < sVar8) * (sVar8 < 0x100) * cVar3 - (0xff < sVar8),CONCAT18(cVar15,uVar68));
    cVar3 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar82 - (0xff < sVar9);
    auVar69[10] = cVar3;
    auVar69[0xb] = (0 < sVar10) * (sVar10 < 0x100) * cVar2 - (0xff < sVar10);
    cVar2 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar83 - (0xff < sVar11);
    auVar72[0xc] = cVar2;
    auVar72._0_12_ = auVar69;
    auVar72[0xd] = (0 < sVar12) * (sVar12 < 0x100) * cVar1 - (0xff < sVar12);
    cVar1 = (0 < sVar13) * (sVar13 < 0x100) * (char)iVar84 - (0xff < sVar13);
    auVar76[0xe] = cVar1;
    auVar76._0_14_ = auVar72;
    auVar76[0xf] = (0 < sVar14) * (sVar14 < 0x100) * cVar17 - (0xff < sVar14);
    sVar7 = (short)((uint)uVar61 >> 0x10);
    sVar8 = (short)((uint6)uVar67 >> 0x20);
    sVar9 = (short)((ulong)uVar68 >> 0x30);
    sVar10 = (short)((unkuint10)auVar69._0_10_ >> 0x40);
    sVar11 = auVar69._10_2_;
    sVar12 = auVar72._12_2_;
    sVar13 = auVar76._14_2_;
    cVar1 = (0 < sVar13) * (sVar13 < 0x100) * cVar1 - (0xff < sVar13);
    uVar54 = CONCAT11((0 < sVar59) * (sVar59 < 0x100) * cVar16 - (0xff < sVar59),cVar1);
    uVar31 = CONCAT12((0 < sVar7) * (sVar7 < 0x100) * cVar6 - (0xff < sVar7),uVar54);
    uVar56 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),uVar31);
    uVar41 = CONCAT14((0 < sVar9) * (sVar9 < 0x100) * cVar4 - (0xff < sVar9),uVar56);
    auVar49[5] = (0 < sVar10) * (sVar10 < 0x100) * cVar15 - (0xff < sVar10);
    auVar49._0_5_ = uVar41;
    auVar49._6_8_ = 0;
    auVar32[0xe] = cVar1;
    auVar32._0_14_ = auVar49 << 0x38;
    auVar42._4_8_ = 0;
    auVar42._0_4_ = uVar56;
    auVar43._12_3_ =
         (int3)(CONCAT26(auVar32._13_2_,
                         CONCAT15((0 < sVar12) * (sVar12 < 0x100) * cVar2 - (0xff < sVar12),uVar41))
               >> 0x28);
    auVar43._0_12_ = auVar42 << 0x38;
    auVar48._10_5_ =
         (int5)(CONCAT44(auVar43._11_4_,
                         CONCAT13((0 < sVar11) * (sVar11 < 0x100) * cVar3 - (0xff < sVar11),uVar31))
               >> 0x18);
    auVar48._0_10_ = (unkuint10)uVar54 << 0x38;
    auVar36._8_8_ = 0;
    auVar36._0_8_ =
         CONCAT62(auVar48._9_6_,
                  CONCAT11((0 < sVar10) * (sVar10 < 0x100) * cVar15 - (0xff < sVar10),cVar1)) >> 8;
    auVar23._9_7_ = 0;
    auVar23._0_9_ = SUB169(auVar36 << 0x40,7);
    auVar22._10_6_ = 0;
    auVar22._0_10_ = SUB1610(auVar23 << 0x38,6);
    auVar21._11_5_ = 0;
    auVar21._0_11_ = SUB1611(auVar22 << 0x30,5);
    auVar35._12_4_ = 0;
    auVar35._0_12_ = SUB1612(auVar21 << 0x28,4);
    auVar20._1_13_ = SUB1613(auVar35 << 0x20,3);
    auVar20[0] = (0 < sVar7) * (sVar7 < 0x100) * cVar6 - (0xff < sVar7);
    *(ushort *)dstPtr =
         auVar20._0_2_ * 2 |
         (ushort)(byte)((0 < sVar59) * (sVar59 < 0x100) * cVar16 - (0xff < sVar59)) * 0x40 |
         (ushort)(0.19607843 < (float)((uint)color >> 0x18) / 255.0) | (ushort)((int)fVar62 << 0xb);
    break;
  case 6:
    fVar62 = roundf(((float)((uint)color & 0xff) / 255.0) * 15.0);
    fVar63 = roundf(((float)((uint)color >> 0x18) / 255.0) * 15.0);
    auVar78._0_4_ = (float)(uVar58 & 0xff);
    auVar78._4_4_ = (float)bVar55;
    auVar78._8_8_ = 0;
    auVar79 = divps(auVar78,_DAT_0015d8c0);
    fVar64 = roundf(auVar79._0_4_ * 15.0);
    fVar65 = roundf(auVar79._4_4_ * 15.0);
    iVar66 = (int)fVar64;
    iVar82 = (int)fVar65;
    iVar83 = (int)extraout_XMM0_Db_03;
    iVar84 = (int)extraout_XMM0_Db_04;
    sVar7 = (short)iVar66;
    cVar1 = (0 < sVar7) * (sVar7 < 0x100) * (char)iVar66 - (0xff < sVar7);
    sVar8 = (short)((uint)iVar66 >> 0x10);
    cVar15 = (char)((uint)iVar66 >> 0x10);
    sVar59 = CONCAT11((0 < sVar8) * (sVar8 < 0x100) * cVar15 - (0xff < sVar8),cVar1);
    sVar9 = (short)iVar82;
    cVar2 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar82 - (0xff < sVar9);
    sVar10 = (short)((uint)iVar82 >> 0x10);
    cVar16 = (char)((uint)iVar82 >> 0x10);
    uVar61 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * cVar16 - (0xff < sVar10),
                      CONCAT12(cVar2,sVar59));
    sVar11 = (short)iVar83;
    cVar3 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar83 - (0xff < sVar11);
    sVar12 = (short)((uint)iVar83 >> 0x10);
    cVar17 = (char)((uint)iVar83 >> 0x10);
    uVar67 = CONCAT15((0 < sVar12) * (sVar12 < 0x100) * cVar17 - (0xff < sVar12),
                      CONCAT14(cVar3,uVar61));
    sVar13 = (short)iVar84;
    cVar4 = (0 < sVar13) * (sVar13 < 0x100) * (char)iVar84 - (0xff < sVar13);
    sVar14 = (short)((uint)iVar84 >> 0x10);
    cVar18 = (char)((uint)iVar84 >> 0x10);
    uVar68 = CONCAT17((0 < sVar14) * (sVar14 < 0x100) * cVar18 - (0xff < sVar14),
                      CONCAT16(cVar4,uVar67));
    cVar5 = (0 < sVar7) * (sVar7 < 0x100) * (char)iVar66 - (0xff < sVar7);
    auVar71._0_10_ =
         CONCAT19((0 < sVar8) * (sVar8 < 0x100) * cVar15 - (0xff < sVar8),CONCAT18(cVar5,uVar68));
    cVar6 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar82 - (0xff < sVar9);
    auVar71[10] = cVar6;
    auVar71[0xb] = (0 < sVar10) * (sVar10 < 0x100) * cVar16 - (0xff < sVar10);
    cVar16 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar83 - (0xff < sVar11);
    auVar74[0xc] = cVar16;
    auVar74._0_12_ = auVar71;
    auVar74[0xd] = (0 < sVar12) * (sVar12 < 0x100) * cVar17 - (0xff < sVar12);
    cVar15 = (0 < sVar13) * (sVar13 < 0x100) * (char)iVar84 - (0xff < sVar13);
    auVar80[0xe] = cVar15;
    auVar80._0_14_ = auVar74;
    auVar80[0xf] = (0 < sVar14) * (sVar14 < 0x100) * cVar18 - (0xff < sVar14);
    sVar7 = (short)((uint)uVar61 >> 0x10);
    sVar8 = (short)((uint6)uVar67 >> 0x20);
    sVar9 = (short)((ulong)uVar68 >> 0x30);
    sVar10 = (short)((unkuint10)auVar71._0_10_ >> 0x40);
    sVar11 = auVar71._10_2_;
    sVar12 = auVar74._12_2_;
    sVar13 = auVar80._14_2_;
    cVar15 = (0 < sVar13) * (sVar13 < 0x100) * cVar15 - (0xff < sVar13);
    uVar54 = CONCAT11((0 < sVar59) * (sVar59 < 0x100) * cVar1 - (0xff < sVar59),cVar15);
    uVar31 = CONCAT12((0 < sVar7) * (sVar7 < 0x100) * cVar2 - (0xff < sVar7),uVar54);
    uVar56 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar3 - (0xff < sVar8),uVar31);
    uVar41 = CONCAT14((0 < sVar9) * (sVar9 < 0x100) * cVar4 - (0xff < sVar9),uVar56);
    auVar53[5] = (0 < sVar10) * (sVar10 < 0x100) * cVar5 - (0xff < sVar10);
    auVar53._0_5_ = uVar41;
    auVar53._6_8_ = 0;
    auVar34[0xe] = cVar15;
    auVar34._0_14_ = auVar53 << 0x38;
    auVar46._4_8_ = 0;
    auVar46._0_4_ = uVar56;
    auVar47._12_3_ =
         (int3)(CONCAT26(auVar34._13_2_,
                         CONCAT15((0 < sVar12) * (sVar12 < 0x100) * cVar16 - (0xff < sVar12),uVar41)
                        ) >> 0x28);
    auVar47._0_12_ = auVar46 << 0x38;
    auVar52._10_5_ =
         (int5)(CONCAT44(auVar47._11_4_,
                         CONCAT13((0 < sVar11) * (sVar11 < 0x100) * cVar6 - (0xff < sVar11),uVar31))
               >> 0x18);
    auVar52._0_10_ = (unkuint10)uVar54 << 0x38;
    auVar40._8_8_ = 0;
    auVar40._0_8_ =
         CONCAT62(auVar52._9_6_,
                  CONCAT11((0 < sVar10) * (sVar10 < 0x100) * cVar5 - (0xff < sVar10),cVar15)) >> 8;
    auVar30._9_7_ = 0;
    auVar30._0_9_ = SUB169(auVar40 << 0x40,7);
    auVar29._10_6_ = 0;
    auVar29._0_10_ = SUB1610(auVar30 << 0x38,6);
    auVar79._11_5_ = 0;
    auVar79._0_11_ = SUB1611(auVar29 << 0x30,5);
    auVar39._12_4_ = 0;
    auVar39._0_12_ = SUB1612(auVar79 << 0x28,4);
    auVar28._1_13_ = SUB1613(auVar39 << 0x20,3);
    auVar28[0] = (0 < sVar7) * (sVar7 < 0x100) * cVar2 - (0xff < sVar7);
    uVar60 = (ushort)(byte)((0 < sVar59) * (sVar59 < 0x100) * cVar1 - (0xff < sVar59)) * 0x100;
    uVar81 = auVar28._0_2_ * 0x10;
    uVar54 = (ushort)(int)fVar63 & 0xff | (ushort)((int)fVar62 << 0xc);
LAB_0013faed:
    *(ushort *)dstPtr = uVar81 | uVar60 | uVar54;
    break;
  case 7:
    *(uchar *)dstPtr = color.r;
    *(byte *)((long)dstPtr + 1) = bVar57;
    *(byte *)((long)dstPtr + 2) = bVar55;
    *(uchar *)((long)dstPtr + 3) = color.a;
  }
  return;
}

Assistant:

void SetPixelColor(void *dstPtr, Color color, int format)
{
    switch (format)
    {
        case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE:
        {
            // NOTE: Calculate grayscale equivalent color
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };
            unsigned char gray = (unsigned char)((coln.x*0.299f + coln.y*0.587f + coln.z*0.114f)*255.0f);

            ((unsigned char *)dstPtr)[0] = gray;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
        {
            // NOTE: Calculate grayscale equivalent color
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };
            unsigned char gray = (unsigned char)((coln.x*0.299f + coln.y*0.587f + coln.z*0.114f)*255.0f);

            ((unsigned char *)dstPtr)[0] = gray;
            ((unsigned char *)dstPtr)[1] = color.a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
        {
            // NOTE: Calculate R5G6B5 equivalent color
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };

            unsigned char r = (unsigned char)(round(coln.x*31.0f));
            unsigned char g = (unsigned char)(round(coln.y*63.0f));
            unsigned char b = (unsigned char)(round(coln.z*31.0f));

            ((unsigned short *)dstPtr)[0] = (unsigned short)r << 11 | (unsigned short)g << 5 | (unsigned short)b;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
        {
            // NOTE: Calculate R5G5B5A1 equivalent color
            Vector4 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f, (float)color.a/255.0f };

            unsigned char r = (unsigned char)(round(coln.x*31.0f));
            unsigned char g = (unsigned char)(round(coln.y*31.0f));
            unsigned char b = (unsigned char)(round(coln.z*31.0f));
            unsigned char a = (coln.w > ((float)PIXELFORMAT_UNCOMPRESSED_R5G5B5A1_ALPHA_THRESHOLD/255.0f))? 1 : 0;;

            ((unsigned short *)dstPtr)[0] = (unsigned short)r << 11 | (unsigned short)g << 6 | (unsigned short)b << 1 | (unsigned short)a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
        {
            // NOTE: Calculate R5G5B5A1 equivalent color
            Vector4 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f, (float)color.a/255.0f };

            unsigned char r = (unsigned char)(round(coln.x*15.0f));
            unsigned char g = (unsigned char)(round(coln.y*15.0f));
            unsigned char b = (unsigned char)(round(coln.z*15.0f));
            unsigned char a = (unsigned char)(round(coln.w*15.0f));

            ((unsigned short *)dstPtr)[0] = (unsigned short)r << 12 | (unsigned short)g << 8 | (unsigned short)b << 4 | (unsigned short)a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R8G8B8:
        {
            ((unsigned char *)dstPtr)[0] = color.r;
            ((unsigned char *)dstPtr)[1] = color.g;
            ((unsigned char *)dstPtr)[2] = color.b;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
        {
            ((unsigned char *)dstPtr)[0] = color.r;
            ((unsigned char *)dstPtr)[1] = color.g;
            ((unsigned char *)dstPtr)[2] = color.b;
            ((unsigned char *)dstPtr)[3] = color.a;

        } break;
        default: break;
    }
}